

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

ON_DimStyle *
ON_DimStyle::CreateFromFont
          (ON_Font *font_characteristics,double model_view_text_scale,ON_DimStyle *dimstyle_settings
          ,ON_ComponentManifest *manifest,ON_DimStyle *destination)

{
  ON__UINT32 OVar1;
  undefined8 uVar2;
  bool bVar3;
  wchar_t *pwVar4;
  ON_wString name;
  ON_wString font_description;
  uint in_stack_ffffffffffffffbc;
  ON_ComponentManifest local_38;
  double local_28;
  
  if (font_characteristics == (ON_Font *)0x0) {
    font_characteristics = &ON_Font::Default;
  }
  if (dimstyle_settings == (ON_DimStyle *)0x0) {
    dimstyle_settings = &Default;
  }
  local_28 = model_view_text_scale;
  if (destination == (ON_DimStyle *)0x0) {
    destination = (ON_DimStyle *)operator_new(0x450);
    ON_DimStyle(destination,dimstyle_settings);
  }
  else if (dimstyle_settings != destination) {
    operator=(destination,dimstyle_settings);
  }
  ON_ModelComponent::ClearModelComponentAttributes(&destination->super_ON_ModelComponent,0x1ff);
  SetFont(destination,font_characteristics);
  if (0.0 < local_28) {
    bVar3 = ON_IsValid(local_28);
    if (bVar3) {
      SetDimScale(destination,local_28);
    }
  }
  ON_Font::Description
            ((ON_Font *)&stack0xffffffffffffffd0,(NameLocale)font_characteristics,L'\0',L'-',true,
             true);
  bVar3 = ON_wString::IsNotEmpty((ON_wString *)&stack0xffffffffffffffd0);
  if (bVar3) {
    if (manifest == (ON_ComponentManifest *)0x0) {
      ON_wString::ON_wString((ON_wString *)&local_38,(ON_wString *)&stack0xffffffffffffffd0);
    }
    else {
      pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&stack0xffffffffffffffd0);
      ON_ComponentManifest::UnusedName
                (&local_38,(Type)manifest,(ON_UUID)ZEXT816(8),(wchar_t *)(uchar  [8])0x0,pwVar4,
                 (wchar_t *)0x0,0,(uint *)((ulong)in_stack_ffffffffffffffbc << 0x20));
    }
    pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_38);
    ON_ModelComponent::SetName(&destination->super_ON_ModelComponent,pwVar4);
    ON_wString::~ON_wString((ON_wString *)&local_38);
  }
  OVar1 = destination->m_field_override_parent_count;
  destination->m_field_override_parent_count = 0;
  destination->m_field_override_parent_bits0 = 0;
  destination->m_field_override_parent_bits1 = 0;
  destination->m_field_override_parent_bits2 = 0;
  destination->m_field_override_parent_bits3 = 0;
  if (OVar1 != 0) {
    ON_ModelComponent::IncrementContentVersionNumber(&destination->super_ON_ModelComponent);
    *(undefined4 *)((destination->m_content_hash).m_digest + 0x10) =
         ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
    uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
    *(undefined8 *)(destination->m_content_hash).m_digest =
         ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
    *(undefined8 *)((destination->m_content_hash).m_digest + 8) = uVar2;
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffd0);
  return destination;
}

Assistant:

ON_DimStyle* ON_DimStyle::CreateFromFont(
  const ON_Font* font_characteristics,
  double model_view_text_scale,
  const ON_DimStyle* dimstyle_settings,
  const class ON_ComponentManifest* manifest,
  ON_DimStyle* destination
)
{
  if (nullptr == font_characteristics)
    font_characteristics = &ON_Font::Default;

  if (nullptr == dimstyle_settings)
  {
    dimstyle_settings = &ON_DimStyle::Default;
  }
  if (nullptr == destination)
    destination = new ON_DimStyle(*dimstyle_settings);
  else 
  {
    if (destination != dimstyle_settings)
      *destination = *dimstyle_settings;
  }

  destination->ClearModelComponentAttributes(ON_ModelComponent::Attributes::AllAttributes);

  destination->SetFont(*font_characteristics);

  if ( model_view_text_scale > 0.0 && ON_IsValid(model_view_text_scale))
    destination->SetDimScale(model_view_text_scale);

  // Dale Lear RH-63824 May 3, 2021
  // It is critical that bIncludeNotOnDevice be set to false.
  // Otherwise missing fonts will have a description beginning with "[Not on device]"
  // and square brackets are not permitted in names.
  // This code is inventing a Rhino 6/7 dimstyle name from a V4 text style.
  // The text style names were unreliable in V4 and we've used the font
  // description as a proxy for years now.
  const bool bIncludeNotOnDevice = false;

  const ON_wString font_description = font_characteristics->Description(ON_Font::NameLocale::LocalizedFirst, ON_wString::HyphenMinus, ON_wString::Space, true, bIncludeNotOnDevice);
  if (font_description.IsNotEmpty())
  {
    const ON_wString name
      = (nullptr != manifest)
      ? manifest->UnusedName(ON_ModelComponent::Type::DimStyle, ON_nil_uuid, font_description, nullptr, nullptr, 0, nullptr)
      : font_description;
    destination->SetName(name);
  }

  // The calls to destination->SetFont() and destination->SetDimScale()
  // set the overrides.
  destination->ClearAllFieldOverrides();

  return destination;
}